

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

int rnndec_varadd(rnndeccontext *ctx,char *varset,char *variant)

{
  int iVar1;
  rnnenum *prVar2;
  undefined8 *puVar3;
  void *pvVar4;
  char *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  rnndecvariant *ci;
  int i;
  rnnenum *en;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  rnndb *in_stack_ffffffffffffffd8;
  
  prVar2 = rnn_findenum(in_stack_ffffffffffffffd8,
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (prVar2 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",in_RSI);
  }
  else {
    for (iVar5 = 0; iVar5 < prVar2->valsnum; iVar5 = iVar5 + 1) {
      iVar1 = strcasecmp(prVar2->vals[iVar5]->name,in_RDX);
      if (iVar1 == 0) {
        puVar3 = (undefined8 *)calloc(0x10,1);
        *puVar3 = prVar2;
        *(int *)(puVar3 + 1) = iVar5;
        if (*(int *)(in_RDI + 0x14) <= *(int *)(in_RDI + 0x10)) {
          if (*(int *)(in_RDI + 0x14) == 0) {
            *(undefined4 *)(in_RDI + 0x14) = 0x10;
          }
          else {
            *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) << 1;
          }
          pvVar4 = realloc(*(void **)(in_RDI + 8),(long)*(int *)(in_RDI + 0x14) << 3);
          *(void **)(in_RDI + 8) = pvVar4;
        }
        iVar5 = *(int *)(in_RDI + 0x10);
        *(int *)(in_RDI + 0x10) = iVar5 + 1;
        *(undefined8 **)(*(long *)(in_RDI + 8) + (long)iVar5 * 8) = puVar3;
        return 1;
      }
    }
    fprintf(_stderr,"Variant %s doesn\'t exist in enum %s!\n",in_RDX,in_RSI);
  }
  return 0;
}

Assistant:

int rnndec_varadd(struct rnndeccontext *ctx, char *varset, char *variant) {
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcasecmp(en->vals[i]->name, variant)) {
			struct rnndecvariant *ci = calloc (sizeof *ci, 1);
			ci->en = en;
			ci->variant = i;
			ADDARRAY(ctx->vars, ci);
			return 1;
		}
	fprintf (stderr, "Variant %s doesn't exist in enum %s!\n", variant, varset);
	return 0;
}